

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

void compute_ui_entry_values_for_object
               (ui_entry *entry,object *obj,player *p,cached_object_data **cache,wchar_t *val,
               wchar_t *auxval)

{
  wchar_t element;
  curse_data *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  _Bool _Var8;
  int iVar9;
  cached_object_data *pcVar10;
  ui_entry_combiner_state_conflict *extraout_RDX;
  ui_entry_combiner_state_conflict *extraout_RDX_00;
  ui_entry_combiner_state_conflict *extraout_RDX_01;
  ui_entry_combiner_state_conflict *extraout_RDX_02;
  ui_entry_combiner_state_conflict *extraout_RDX_03;
  ui_entry_combiner_state_conflict *extraout_RDX_04;
  ui_entry_combiner_state_conflict *extraout_RDX_05;
  ui_entry_combiner_state_conflict *extraout_RDX_06;
  ui_entry_combiner_state_conflict *extraout_RDX_07;
  ui_entry_combiner_state_conflict *extraout_RDX_08;
  ui_entry_combiner_state_conflict *extraout_RDX_09;
  ui_entry_combiner_state_conflict *extraout_RDX_10;
  ui_entry_combiner_state_conflict *puVar11;
  ui_entry_combiner_state_conflict *extraout_RDX_11;
  ui_entry_combiner_state_conflict *extraout_RDX_12;
  ui_entry_combiner_state_conflict *extraout_RDX_13;
  player *ppVar12;
  wchar_t local_d8;
  wchar_t local_d4;
  wchar_t local_d0;
  wchar_t local_cc;
  wchar_t local_bc;
  wchar_t t_3;
  wchar_t a_3;
  wchar_t v_3;
  wchar_t t_2;
  wchar_t a_2;
  wchar_t v_2;
  wchar_t t_1;
  wchar_t a_1;
  wchar_t v_1;
  wchar_t t;
  wchar_t a;
  wchar_t v;
  wchar_t ind;
  wchar_t i;
  wchar_t base;
  wchar_t curse_ind;
  _Bool any_curse_unknown;
  _Bool all_aux;
  _Bool any_aux;
  _Bool all_aux_unknown;
  _Bool all_unknown;
  player *ppStack_78;
  _Bool first;
  cached_object_data *cache2;
  curse_data *curse;
  ui_entry_combiner_funcs_conflict1 combiner;
  ui_entry_combiner_state_conflict cst;
  wchar_t *auxval_local;
  wchar_t *val_local;
  cached_object_data **cache_local;
  player *p_local;
  object *obj_local;
  ui_entry *entry_local;
  
  memset(&combiner.vec_func,0,0x10);
  ind = L'\0';
  if ((obj == (object *)0x0) || (entry->n_obj_prop == L'\0')) {
    *val = L'\x7ffffffe';
    *auxval = L'\x7ffffffe';
  }
  else {
    if (*cache == (cached_object_data *)0x0) {
      pcVar10 = (cached_object_data *)mem_alloc(6);
      *cache = pcVar10;
      flag_wipe((*cache)->f,6);
      if (p == (player *)0x0) {
        object_flags(obj,(*cache)->f);
      }
      else {
        object_flags_known(obj,(*cache)->f);
      }
    }
    bVar2 = true;
    bVar3 = true;
    bVar4 = true;
    bVar6 = false;
    bVar5 = true;
    ppVar12 = (player *)&curse;
    iVar9 = ui_entry_combiner_get_funcs(entry->combiner_index,(ui_entry_combiner_funcs *)ppVar12);
    if (iVar9 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry.c"
                    ,0x27b,
                    "void compute_ui_entry_values_for_object(const struct ui_entry *, const struct object *, const struct player *, struct cached_object_data **, int *, int *)"
                   );
    }
    ppStack_78 = (player *)*cache;
    pcVar1 = obj->curses;
    bVar7 = false;
    i = L'\0';
    puVar11 = extraout_RDX;
    p_local = (player *)obj;
LAB_0023cb21:
    if (p_local != (player *)0x0) {
      for (v = L'\0'; v < entry->n_obj_prop; v = v + L'\x01') {
        element = entry->obj_props[v].index;
        if ((entry->obj_props[v].isaux & 1U) == 0) {
          bVar5 = false;
LAB_0023cba8:
          switch(entry->obj_props[v].type) {
          case L'\x01':
          case L'\x02':
            if (((p == (player *)0x0) || (p->obj_k->modifiers[element] != 0)) ||
               (p_local->stat_max[(long)element + -4] == 0)) {
              t = (wchar_t)p_local->stat_max[(long)element + -4];
              v_1 = L'\0';
              if ((t != L'\0') && ((entry->obj_props[v].have_value & 1U) != 0)) {
                t = entry->obj_props[v].value;
              }
              if ((entry->obj_props[v].isaux & 1U) == 0) {
                bVar3 = false;
              }
              else {
                v_1 = t;
                t = L'\0';
                bVar4 = false;
              }
              if (bVar2) {
                ppVar12 = (player *)(ulong)(uint)v_1;
                (*(code *)curse)(t,ppVar12,&combiner.vec_func);
                bVar2 = false;
                puVar11 = extraout_RDX_00;
              }
              else {
                ppVar12 = (player *)(ulong)(uint)v_1;
                (*combiner.init_func)(t,v_1,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
                puVar11 = extraout_RDX_01;
              }
            }
            else if (L'\0' < i) {
              bVar7 = true;
            }
            break;
          case L'\x03':
            if ((p == (player *)0x0) ||
               (ppVar12 = p_local, _Var8 = object_flag_is_known(p,(object *)p_local,element), _Var8)
               ) {
              _Var8 = flag_has_dbg((bitflag *)ppStack_78,6,element,"cache2->f","ind");
              t_1 = (wchar_t)_Var8;
              v_2 = L'\0';
              if ((t_1 != L'\0') && ((entry->obj_props[v].have_value & 1U) != 0)) {
                t_1 = entry->obj_props[v].value;
              }
              if ((entry->obj_props[v].isaux & 1U) == 0) {
                bVar3 = false;
              }
              else {
                v_2 = t_1;
                t_1 = L'\0';
                bVar4 = false;
              }
              if (bVar2) {
                ppVar12 = (player *)(ulong)(uint)v_2;
                (*(code *)curse)(t_1,ppVar12,&combiner.vec_func);
                bVar2 = false;
                puVar11 = extraout_RDX_03;
              }
              else {
                ppVar12 = (player *)(ulong)(uint)v_2;
                (*combiner.init_func)
                          (t_1,v_2,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
                puVar11 = extraout_RDX_04;
              }
            }
            else {
              puVar11 = extraout_RDX_02;
              if (L'\0' < i) {
                bVar7 = true;
              }
            }
            break;
          case L'\x04':
            ind = L'd';
            if ((p == (player *)0x0) ||
               (ppVar12 = p_local, _Var8 = object_element_is_known(p,(object *)p_local,element),
               _Var8)) {
              t_3 = (wchar_t)p_local->stat_map[(long)element * 2 + 3];
              local_bc = L'd';
              if ((t_3 != L'd') && ((entry->obj_props[v].have_value & 1U) != 0)) {
                t_3 = entry->obj_props[v].value;
              }
              if ((entry->obj_props[v].isaux & 1U) == 0) {
                bVar3 = false;
              }
              else {
                local_bc = t_3;
                t_3 = L'd';
                bVar4 = false;
              }
              if (bVar2) {
                ppVar12 = (player *)(ulong)(uint)local_bc;
                (*(code *)curse)(t_3,ppVar12,&combiner.vec_func);
                bVar2 = false;
                puVar11 = extraout_RDX_09;
              }
              else {
                ppVar12 = (player *)(ulong)(uint)local_bc;
                (*combiner.init_func)
                          (t_3,local_bc,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
                puVar11 = extraout_RDX_10;
              }
            }
            else {
              puVar11 = extraout_RDX_08;
              if (L'\0' < i) {
                bVar7 = true;
              }
            }
            break;
          case L'\x05':
            if ((p == (player *)0x0) ||
               (ppVar12 = p_local, _Var8 = object_element_is_known(p,(object *)p_local,element),
               _Var8)) {
              t_2 = (wchar_t)((p_local->stat_map[(long)element * 2 + 4] & 2) != 0);
              v_3 = L'\0';
              if ((t_2 != L'\0') && ((entry->obj_props[v].have_value & 1U) != 0)) {
                t_2 = entry->obj_props[v].value;
              }
              if ((entry->obj_props[v].isaux & 1U) == 0) {
                bVar3 = false;
              }
              else {
                v_3 = t_2;
                t_2 = L'\0';
                bVar4 = false;
              }
              if (bVar2) {
                ppVar12 = (player *)(ulong)(uint)v_3;
                (*(code *)curse)(t_2,ppVar12,&combiner.vec_func);
                bVar2 = false;
                puVar11 = extraout_RDX_06;
              }
              else {
                ppVar12 = (player *)(ulong)(uint)v_3;
                (*combiner.init_func)
                          (t_2,v_3,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
                puVar11 = extraout_RDX_07;
              }
            }
            else {
              puVar11 = extraout_RDX_05;
              if (L'\0' < i) {
                bVar7 = true;
              }
            }
          }
        }
        else if ((entry->flags & 1U) == 0) {
          bVar6 = true;
          goto LAB_0023cba8;
        }
      }
      if (pcVar1 == (curse_data *)0x0) {
        p_local = (player *)0x0;
      }
      else {
        p_local = (player *)0x0;
        if (i == L'\0') {
          ppStack_78 = (player *)mem_alloc(6);
        }
        do {
          i = i + L'\x01';
          if ((int)(uint)z_info->curse_max <= i) {
            mem_free(ppStack_78);
            puVar11 = extraout_RDX_11;
            goto LAB_0023cb21;
          }
        } while (pcVar1[i].power == L'\0');
        p_local = (player *)curses[i].obj;
        flag_wipe((bitflag *)ppStack_78,6);
        ppVar12 = ppStack_78;
        if (p == (player *)0x0) {
          object_flags((object *)p_local,(bitflag *)ppStack_78);
          puVar11 = extraout_RDX_13;
        }
        else {
          object_flags_known((object *)p_local,(bitflag *)ppStack_78);
          puVar11 = extraout_RDX_12;
        }
      }
      goto LAB_0023cb21;
    }
    if ((bVar3) && (bVar4)) {
      if (bVar5) {
        local_cc = ind;
      }
      else {
        local_cc = L'\x7fffffff';
      }
      *val = local_cc;
      if (bVar6) {
        local_d0 = L'\x7fffffff';
      }
      else {
        local_d0 = ind;
      }
      *auxval = local_d0;
    }
    else {
      (*combiner.accum_func)((int)&combiner + L'\x18',(wchar_t)ppVar12,puVar11);
      if ((bVar3) || (((wchar_t)cst.work == ind && (bVar7)))) {
        if (bVar5) {
          local_d4 = ind;
        }
        else {
          local_d4 = L'\x7fffffff';
        }
        *val = local_d4;
      }
      else {
        *val = (wchar_t)cst.work;
      }
      if ((bVar4) || ((cst.work._4_4_ == ind && (bVar7)))) {
        if (bVar6) {
          local_d8 = L'\x7fffffff';
        }
        else {
          local_d8 = ind;
        }
        *auxval = local_d8;
      }
      else {
        *auxval = cst.work._4_4_;
      }
    }
  }
  return;
}

Assistant:

void compute_ui_entry_values_for_object(const struct ui_entry *entry,
	const struct object *obj, const struct player *p,
	struct cached_object_data **cache, int *val, int *auxval)
{
	struct ui_entry_combiner_state cst = { 0, 0, 0 };
	struct ui_entry_combiner_funcs combiner;
	const struct curse_data *curse;
	struct cached_object_data *cache2;
	bool first, all_unknown, all_aux_unknown, any_aux, all_aux;
	bool any_curse_unknown;
	int curse_ind;
	int base = 0;

	if (!obj || !entry->n_obj_prop) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
		return;
	}
	if (*cache == NULL) {
		*cache = mem_alloc(sizeof(**cache));
		of_wipe((*cache)->f);
		if (p) {
			object_flags_known(obj, (*cache)->f);
		} else {
			object_flags(obj, (*cache)->f);
		}
	}
	first = true;
	all_unknown = true;
	all_aux_unknown = true;
	any_aux = false;
	all_aux = true;
	if (ui_entry_combiner_get_funcs(entry->combiner_index, &combiner)) {
		assert(0);
	}
	cache2 = *cache;
	curse = obj->curses;
	any_curse_unknown = false;
	curse_ind = 0;
	while (obj) {
		int i;

		for (i = 0; i < entry->n_obj_prop; ++i) {
			int ind = entry->obj_props[i].index;

			if (entry->obj_props[i].isaux) {
				if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
					continue;
				}
				any_aux = true;
			} else {
				all_aux = false;
			}

			switch (entry->obj_props[i].type) {
			case OBJ_PROPERTY_STAT:
			case OBJ_PROPERTY_MOD:
				if (!p || p->obj_k->modifiers[ind] != 0 ||
					obj->modifiers[ind] == 0) {
					int v = obj->modifiers[ind];
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_FLAG:
				if (!p || object_flag_is_known(p, obj, ind)) {
					int v = of_has(cache2->f, ind) ? 1 : 0;
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_IGNORE:
				if (!p || object_element_is_known(p, obj, ind)) {
					int v = (obj->el_info[ind].flags &
						EL_INFO_IGNORE) ? 1 : 0;
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_ELEMENT:
				base = RES_LEVEL_BASE;
				if (!p || object_element_is_known(p, obj, ind)) {
					int v = obj->el_info[ind].res_level;
					int a = RES_LEVEL_BASE;

					if (v != base && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			default:
				break;
			}
		}

		if (curse) {
			/*
			 * Proceed to the next unprocessed curse object.
			 * Don't overwrite the cached data for the base.
			 */
			obj = NULL;
			if (curse_ind == 0) {
				cache2 = mem_alloc(sizeof(*cache2));
			}
			++curse_ind;
			while (1) {
				if (curse_ind >= z_info->curse_max) {
					mem_free(cache2);
					break;
				}
				if (curse[curse_ind].power) {
					obj = curses[curse_ind].obj;
					of_wipe(cache2->f);
					if (p) {
						object_flags_known(obj,
							cache2->f);
					} else {
						object_flags(obj, cache2->f);
					}
					break;
				}
				++curse_ind;
			}
		} else {
			obj = NULL;
		}
	}
	if (all_unknown && all_aux_unknown) {
		*val = (all_aux) ? base : UI_ENTRY_UNKNOWN_VALUE;
		*auxval = (any_aux) ? UI_ENTRY_UNKNOWN_VALUE : base;
	} else {
		(*combiner.finish_func)(&cst);
		if (all_unknown || (cst.accum == base && any_curse_unknown)) {
			*val = (all_aux) ? base : UI_ENTRY_UNKNOWN_VALUE;
		} else {
			*val = cst.accum;
		}
		if (all_aux_unknown || (cst.accum_aux == base && any_curse_unknown)) {
			*auxval = (any_aux) ? UI_ENTRY_UNKNOWN_VALUE : base;
		} else {
			*auxval = cst.accum_aux;
		}
	}
}